

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_packbits.c
# Opt level: O1

int PackBitsEncodeChunk(TIFF *tif,uint8_t *bp,tmsize_t cc,uint16_t s)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  long cc_00;
  
  if (0 < cc) {
    lVar1 = *(long *)tif->tif_data;
    do {
      cc_00 = lVar1;
      if (cc < lVar1) {
        cc_00 = cc;
      }
      PackBitsEncode(tif,bp,cc_00,0);
      bp = bp + cc_00;
      lVar3 = cc - cc_00;
      bVar2 = cc_00 <= cc;
      cc = lVar3;
    } while (lVar3 != 0 && bVar2);
  }
  return 1;
}

Assistant:

static int PackBitsEncodeChunk(TIFF *tif, uint8_t *bp, tmsize_t cc, uint16_t s)
{
    tmsize_t rowsize = *(tmsize_t *)tif->tif_data;

    while (cc > 0)
    {
        tmsize_t chunk = rowsize;

        if (cc < chunk)
            chunk = cc;

        if (PackBitsEncode(tif, bp, chunk, s) < 0)
            return (-1);
        bp += chunk;
        cc -= chunk;
    }
    return (1);
}